

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

_Bool operator_string_neg(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  uint32_t len;
  gravity_object_t *pgVar1;
  _Bool _Var2;
  char *p;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar3;
  gravity_fiber_t *fiber;
  gravity_class_t *pgVar4;
  gravity_value_t value;
  char _buffer [4096];
  char local_1028 [4096];
  
  pgVar1 = (args->field_1).p;
  p = string_ndup((char *)pgVar1->objclass,(ulong)*(uint *)((long)&pgVar1->identifier + 4));
  _Var2 = utf8_reverse(p);
  if (_Var2) {
    len = *(uint32_t *)((long)&pgVar1->identifier + 4);
    aVar3.p = (gravity_object_t *)gravity_string_new(vm,p,len,len);
    pgVar4 = (aVar3.p)->isa;
  }
  else {
    builtin_strncpy(local_1028,"Unable to reverse a malformed string.",0x26);
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1028);
    aVar3.n = 0;
    pgVar4 = gravity_class_null;
  }
  value.field_1.n = aVar3.n;
  value.isa = pgVar4;
  gravity_vm_setslot(vm,value,rindex);
  return _Var2;
}

Assistant:

static bool operator_string_neg (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)

    DECLARE_1VARIABLE(v1, 0);

    // reverse the string
    gravity_string_t *s1 = VALUE_AS_STRING(v1);
    char *s = (char *)string_ndup(s1->s, s1->len);
    if (!utf8_reverse(s)) RETURN_ERROR("Unable to reverse a malformed string.");

    gravity_string_t *string = gravity_string_new(vm, s, s1->len, s1->len);
    RETURN_VALUE(VALUE_FROM_OBJECT(string), rindex);
}